

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

char * fs_read_str(char *name)

{
  FILE *__stream;
  char *pcVar1;
  
  __stream = (FILE *)io_open(name,9);
  if (__stream == (FILE *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = io_read_all_str((IOHANDLE)__stream);
    fclose(__stream);
  }
  return pcVar1;
}

Assistant:

char *fs_read_str(const char *name)
{
	IOHANDLE file = io_open(name, IOFLAG_READ | IOFLAG_SKIP_BOM);
	char *result;
	if(!file)
	{
		return 0;
	}
	result = io_read_all_str(file);
	io_close(file);
	return result;
}